

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_data_collection.cpp
# Opt level: O3

bool __thiscall
duckdb::BatchCollectionChunkScanState::LoadNextChunk
          (BatchCollectionChunkScanState *this,ErrorData *error)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = (this->super_ChunkScanState).finished;
  if (bVar1 == false) {
    InternalLoad(this,error);
    bVar2 = ChunkScanState::ChunkIsEmpty(&this->super_ChunkScanState);
    if (bVar2) {
      (this->super_ChunkScanState).finished = true;
    }
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool BatchCollectionChunkScanState::LoadNextChunk(ErrorData &error) {
	if (finished) {
		return false;
	}
	InternalLoad(error);
	if (ChunkIsEmpty()) {
		finished = true;
	}
	return true;
}